

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_buffered_region.cc
# Opt level: O3

void __thiscall
S2ShapeIndexBufferedRegion::GetCellUnionBound
          (S2ShapeIndexBufferedRegion *this,vector<S2CellId,_std::allocator<S2CellId>_> *cellids)

{
  ulong uVar1;
  pointer pSVar2;
  bool bVar3;
  int iVar4;
  int level;
  pointer pSVar5;
  S1Angle value;
  vector<S2CellId,_std::allocator<S2CellId>_> orig_cellids;
  S2CellId id;
  undefined1 local_80 [16];
  VType local_70;
  Iterator IStack_68;
  S1ChordAngle local_60;
  vector<S2CellId,_std::allocator<S2CellId>_> local_58;
  S2CellId local_40;
  S2LogMessage local_38;
  
  local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_80._8_8_ = (this->query_).base_.index_;
  local_80._0_8_ = &PTR__S2ShapeIndexRegion_002bc838;
  local_70 = (VType)CONCAT44(local_70._4_4_,SEMI_OPEN);
  (*((S2ShapeIndex *)local_80._8_8_)->_vptr_S2ShapeIndex[6])(&IStack_68,local_80._8_8_,2);
  local_60.length2_ = (double)&IStack_68;
  S2ShapeIndexRegion<S2ShapeIndex>::GetCellUnionBound
            ((S2ShapeIndexRegion<S2ShapeIndex> *)local_80,&local_58);
  if (IStack_68.iter_._M_t.
      super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
      ._M_t.
      super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
      .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl !=
      (__uniq_ptr_data<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)IStack_68.iter_._M_t.
                          super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                          .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl +
                8))();
  }
  value = S1ChordAngle::ToAngle(&this->radius_);
  iVar4 = S2::Metric<1>::GetLevelForMinValue((Metric<1> *)&S2::kMinWidth,value.radians_);
  pSVar2 = local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (iVar4 < 1) {
    S1ChordAngle::S1ChordAngle(&local_60,4.0);
    local_80._0_8_ = &PTR__S2Region_002bb758;
    local_80._8_8_ = (S2ShapeIndex *)0x3ff0000000000000;
    local_70 = 0.0;
    IStack_68.iter_._M_t.
    super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
    ._M_t.
    super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
    .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl =
         (unique_ptr<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>)
         (__uniq_ptr_data<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>,_true,_true>
          )0x0;
    bVar3 = S2::IsUnitLength((S2Point *)(local_80 + 8));
    if (!bVar3 || 4.0 < local_60.length2_) {
      S2LogMessage::S2LogMessage
                (&local_38,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.h"
                 ,0xf5,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_38.stream_,"Check failed: is_valid() ",0x19);
LAB_002206c3:
      abort();
    }
    S2Cap::GetCellUnionBound((S2Cap *)local_80,cellids);
  }
  else {
    pSVar5 = (cellids->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((cellids->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
        super__Vector_impl_data._M_finish != pSVar5) {
      (cellids->super__Vector_base<S2CellId,_std::allocator<S2CellId>_>)._M_impl.
      super__Vector_impl_data._M_finish = pSVar5;
    }
    if (local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSVar5 = local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        local_40.id_ = pSVar5->id_;
        if ((local_40.id_ & 0xfffffffffffffff) == 0) {
          S1ChordAngle::S1ChordAngle(&local_60,4.0);
          local_80._0_8_ = &PTR__S2Region_002bb758;
          local_80._8_8_ = (S2ShapeIndex *)0x3ff0000000000000;
          local_70 = 0.0;
          IStack_68.iter_._M_t.
          super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
          .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl =
               (unique_ptr<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                )(__uniq_ptr_data<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>,_true,_true>
                  )0x0;
          bVar3 = S2::IsUnitLength((S2Point *)(local_80 + 8));
          if (!bVar3 || 4.0 < local_60.length2_) {
            S2LogMessage::S2LogMessage
                      (&local_38,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.h"
                       ,0xf5,kFatal,(ostream *)&std::cerr);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_38.stream_,"Check failed: is_valid() ",0x19);
            goto LAB_002206c3;
          }
          S2Cap::GetCellUnionBound((S2Cap *)local_80,cellids);
          break;
        }
        uVar1 = 0;
        if (local_40.id_ != 0) {
          for (; (local_40.id_ >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
          }
        }
        level = 0x1d - ((uint)(uVar1 >> 1) & 0x7fffffff);
        if (iVar4 + -1 <= level) {
          level = iVar4 + -1;
        }
        S2CellId::AppendVertexNeighbors(&local_40,level,cellids);
        pSVar5 = pSVar5 + 1;
      } while (pSVar5 != pSVar2);
    }
  }
  if (local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void S2ShapeIndexBufferedRegion::GetCellUnionBound(vector<S2CellId> *cellids)
    const {
  // We start with a covering of the original S2ShapeIndex, and then expand it
  // by replacing each cell with a block of 4 cells whose union contains the
  // original cell buffered by the given radius.
  //
  // This increases the number of cells in the covering by a factor of 4 and
  // increases the covered area by a factor of 16, so it is not a very good
  // covering, but it is much better than always returning the 6 face cells.
  vector<S2CellId> orig_cellids;
  MakeS2ShapeIndexRegion(&index()).GetCellUnionBound(&orig_cellids);

  double radians = radius_.ToAngle().radians();
  int max_level = S2::kMinWidth.GetLevelForMinValue(radians) - 1;
  if (max_level < 0) {
    return S2Cap::Full().GetCellUnionBound(cellids);
  }
  cellids->clear();
  for (S2CellId id : orig_cellids) {
    if (id.is_face()) {
      return S2Cap::Full().GetCellUnionBound(cellids);
    }
    id.AppendVertexNeighbors(min(max_level, id.level() - 1), cellids);
  }
}